

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::Compilation::getSemanticDiagnostics(Compilation *this)

{
  bool bVar1;
  optional<slang::Diagnostics> *in_RDI;
  SourceManager *in_stack_00000220;
  ASTDiagMap *in_stack_00000228;
  Compilation *in_stack_000006c0;
  char *__args;
  Diagnostics *local_8;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::Diagnostics> *)0x8befb8);
  if (bVar1) {
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x8befcf)
    ;
  }
  else {
    elaborate(in_stack_000006c0);
    __args = (char *)((long)in_RDI[6].super__Optional_base<slang::Diagnostics,_false,_false>.
                            _M_payload.
                            super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
                            super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
                            super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x18);
    ASTDiagMap::coalesce(in_stack_00000228,in_stack_00000220);
    std::optional<slang::Diagnostics>::emplace<slang::Diagnostics>(in_RDI,(Diagnostics *)__args);
    Diagnostics::~Diagnostics((Diagnostics *)0x8bf029);
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x8bf03a)
    ;
  }
  return local_8;
}

Assistant:

const Diagnostics& Compilation::getSemanticDiagnostics() {
    if (cachedSemanticDiagnostics)
        return *cachedSemanticDiagnostics;

    // Elaborate the design.
    elaborate();

    cachedSemanticDiagnostics.emplace(diagMap.coalesce(sourceManager));
    return *cachedSemanticDiagnostics;
}